

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cpp
# Opt level: O1

bool __thiscall ast::Identifier::evaluate(Identifier *this)

{
  Value_type VVar1;
  int iVar2;
  string local_38;
  
  VVar1 = Symbol::get_type(this->symbol);
  if (VVar1 == UNDEFINED) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Undefined symbol","");
    error_report(&(this->super_Expression).location,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    (this->super_Expression).type = INVALID;
  }
  else {
    (this->super_Expression).type = VVar1;
    if (VVar1 != INVALID) {
      iVar2 = Symbol::get_value(this->symbol);
      (this->super_Expression).value = iVar2;
      return true;
    }
  }
  return false;
}

Assistant:

bool Identifier::evaluate()
{
	auto symbol_type = symbol->get_type();
	if (symbol_type == UNDEFINED) {
		error_report(&location, "Undefined symbol");
		type = INVALID;
		return false;
	}
	type = symbol_type;
	if (symbol_type == INVALID)
		return false;
	value = symbol->get_value();
	return true;
}